

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer_4.cxx
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"a_func = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,100);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"b_func = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x32);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main(){
    int a= 10;

    calc(&a,a_func);
    std::cout << "a_func = " << a << std::endl;

    a = 10;
    calc(&a,b_func);
    std::cout << "b_func = " << a << std::endl;
}